

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IncDecVerify.cpp
# Opt level: O0

void incdec_verify::PreIncTestInt32(void)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  SafeIntException *anon_var_0;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> vv;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> si;
  bool fSuccess;
  size_t i;
  allocator *in_stack_ffffffffffffff90;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  *in_stack_ffffffffffffffa0;
  allocator local_51;
  string local_50 [43];
  int in_stack_ffffffffffffffdc;
  string *in_stack_ffffffffffffffe0;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_10;
  byte local_9;
  ulong local_8;
  
  for (local_8 = 0; local_8 < 9; local_8 = local_8 + 1) {
    local_9 = 1;
    SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
              (&local_10,(int *)(inc_int32 + local_8 * 0xc));
    in_stack_ffffffffffffffa0 =
         SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
         operator++(in_stack_ffffffffffffffa0);
    unique0x00011f80 = in_stack_ffffffffffffffa0->m_int;
    bVar3 = operator!=((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        )(int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                       (int)in_stack_ffffffffffffff90);
    if (bVar3) {
      local_9 = 0;
    }
    if ((local_9 & 1) != (inc_int32[local_8 * 0xc + 8] & 1)) {
      in_stack_ffffffffffffff90 = &local_51;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_50,"Error in case inc_int32 throw (1): ",in_stack_ffffffffffffff90);
      iVar2 = stack0xffffffffffffffd8;
      uVar1 = (uint)stack0xffffffffffffffd8 >> 0x18;
      bVar3 = SUB41(uVar1,0);
      unique0x10000139 = iVar2;
      err_msg<int>(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,bVar3);
      std::__cxx11::string::~string(local_50);
      std::allocator<char>::~allocator((allocator<char> *)&local_51);
    }
  }
  return;
}

Assistant:

void PreIncTestInt32()
{
	size_t i;

	for( i = 0; i < COUNTOF(inc_int32); ++i )
	{
		bool fSuccess = true;
		try
		{
			SafeInt< std::int32_t > si(inc_int32[i].x);
			SafeInt< std::int32_t > vv = ++si;

			if(vv != inc_int32[i].y)
			{
				fSuccess = false;
			}
		}
		catch(SafeIntException&)
		{
			fSuccess = false;
		}

		if( fSuccess != inc_int32[i].fExpected )
		{
			err_msg( "Error in case inc_int32 throw (1): ", inc_int32[i].x, inc_int32[i].fExpected );
		}
	}
}